

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O1

void anon_unknown.dwarf_22b41::fillChannels(Rand48 *random,DeepImage *img)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  DeepImageLevel *pDVar5;
  
  iVar1 = Imf_3_2::Image::levelMode();
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        level 0",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    pDVar5 = (DeepImageLevel *)(**(code **)(*(long *)img + 0x18))(img,0);
    fillChannels(random,pDVar5);
    return;
  }
  if (iVar1 == 1) {
    iVar1 = Imf_3_2::Image::numLevels();
    if (0 < iVar1) {
      iVar1 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"        level ",0xe);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"",0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pDVar5 = (DeepImageLevel *)(**(code **)(*(long *)img + 0x18))(img,iVar1);
        fillChannels(random,pDVar5);
        iVar1 = iVar1 + 1;
        iVar2 = Imf_3_2::Image::numLevels();
      } while (iVar1 < iVar2);
    }
  }
  else {
    if (iVar1 != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                    ,0x115,"void (anonymous namespace)::fillChannels(Rand48 &, DeepImage &)");
    }
    iVar1 = Imf_3_2::Image::numYLevels();
    if (0 < iVar1) {
      iVar1 = 0;
      do {
        iVar2 = Imf_3_2::Image::numXLevels();
        if (0 < iVar2) {
          iVar2 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"        level (",0xf);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            pDVar5 = (DeepImageLevel *)(**(code **)(*(long *)img + 0x28))(img,iVar2,iVar1);
            fillChannels(random,pDVar5);
            iVar2 = iVar2 + 1;
            iVar3 = Imf_3_2::Image::numXLevels();
          } while (iVar2 < iVar3);
        }
        iVar1 = iVar1 + 1;
        iVar2 = Imf_3_2::Image::numYLevels();
      } while (iVar1 < iVar2);
    }
  }
  return;
}

Assistant:

void
fillChannels (Rand48& random, DeepImage& img)
{
    switch (img.levelMode ())
    {
        case ONE_LEVEL:

            cout << "        level 0" << endl;
            fillChannels (random, img.level ());

            break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img.numLevels (); ++x)
            {
                cout << "        level " << x << "" << endl;
                fillChannels (random, img.level (x));
            }

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img.numYLevels (); ++y)
            {
                for (int x = 0; x < img.numXLevels (); ++x)
                {
                    cout << "        level (" << x << ", " << y << ")" << endl;
                    fillChannels (random, img.level (x, y));
                }
            }

            break;

        default: assert (false);
    }
}